

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O2

void __thiscall Js::JavascriptWeakMap::Set(JavascriptWeakMap *this,RecyclableObject *key,Var value)

{
  WeakMapKeyMap *this_00;
  RecyclableObject *local_30;
  RecyclableObject *key_local;
  Var value_local;
  
  local_30 = key;
  key_local = (RecyclableObject *)value;
  this_00 = GetWeakMapKeyMapFromKey(this,key);
  if (this_00 == (WeakMapKeyMap *)0x0) {
    this_00 = AddWeakMapKeyMapToKey(this,key);
  }
  value_local = (Var)((ulong)this | 1);
  JsUtil::
  BaseDictionary<void*,void*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<void*,void*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<void*,void*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_00,&value_local,&key_local);
  value_local = (Var)CONCAT71(value_local._1_7_,1);
  JsUtil::
  SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
  ::
  Insert<(JsUtil::SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
            ((SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
              *)&this->keySet,&local_30,(TBValue *)&value_local);
  return;
}

Assistant:

void JavascriptWeakMap::Set(RecyclableObject* key, Var value)
    {
        WeakMapKeyMap* keyMap = GetWeakMapKeyMapFromKey(key);

        if (keyMap == nullptr)
        {
            keyMap = AddWeakMapKeyMapToKey(key);
        }

        keyMap->Item(GetWeakMapId(), value);
        keySet.Item(key, true);
    }